

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O1

void __thiscall
so_5::disp::prio_dedicated_threads::one_per_prio::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::~dispatcher_template_t
          (dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
           *this)

{
  (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t =
       (_func_int **)&PTR__dispatcher_template_t_0028f160;
  std::
  vector<std::unique_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_std::default_delete<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>_>,_std::allocator<std::unique_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_std::default_delete<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>_>_>_>
  ::~vector(&this->m_threads);
  stats::manually_registered_source_t::~manually_registered_source_t
            (&(this->m_data_source).super_manually_registered_source_t);
  so_5::dispatcher_t::~dispatcher_t((dispatcher_t *)this);
  operator_delete(this);
  return;
}

Assistant:

dispatcher_template_t( disp_params_t params )
			:	m_data_source{ self() }
			{
				m_threads.reserve( so_5::prio::total_priorities_count );
				so_5::prio::for_each_priority( [&]( so_5::priority_t ) {
						auto lock_factory = params.queue_params().lock_factory();

						auto t = so_5::stdcpp::make_unique< WORK_THREAD >(
								std::move(lock_factory) );

						m_threads.push_back( std::move(t) );
					} );
			}